

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day19.cpp
# Opt level: O2

void day19(input_t input)

{
  uint32_t uVar1;
  pointer paVar2;
  bool bVar3;
  char cVar4;
  long lVar5;
  byte bVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  char *pcVar13;
  int iVar14;
  bool bVar15;
  uint32_t divisor_sum;
  uint32_t local_9c;
  array<unsigned_int,_2UL> part;
  Quad tmp;
  uint32_t R [8];
  vector<std::array<signed_char,_4UL>,_std::allocator<std::array<signed_char,_4UL>_>_> V;
  uint32_t local_4c [3];
  anon_class_16_2_9b1e4325 try_factor;
  
  lVar5 = input.len;
  pcVar13 = input.s;
  do {
    bVar15 = lVar5 == 0;
    lVar5 = lVar5 + -1;
    if (bVar15) {
LAB_0010e558:
      abort();
    }
    cVar4 = *pcVar13;
    pcVar13 = pcVar13 + 1;
    bVar6 = cVar4 - 0x30;
  } while (5 < bVar6);
  V.super__Vector_base<std::array<signed_char,_4UL>,_std::allocator<std::array<signed_char,_4UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  V.super__Vector_base<std::array<signed_char,_4UL>,_std::allocator<std::array<signed_char,_4UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  V.super__Vector_base<std::array<signed_char,_4UL>,_std::allocator<std::array<signed_char,_4UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar14 = 0;
  cVar4 = '\0';
  bVar15 = false;
  for (lVar12 = 0; lVar5 != lVar12; lVar12 = lVar12 + 1) {
    if ((byte)(pcVar13[lVar12] - 0x30U) < 100) {
      cVar4 = (pcVar13[lVar12] - 0x30U) + cVar4 * '\n';
      bVar3 = true;
    }
    else {
      bVar3 = false;
      if (bVar15) {
        tmp._M_elems[iVar14] = cVar4;
        iVar14 = iVar14 + 1;
        cVar4 = '\0';
        bVar3 = false;
        if (iVar14 == 4) {
          iVar14 = 0;
          std::vector<std::array<signed_char,_4UL>,_std::allocator<std::array<signed_char,_4UL>_>_>
          ::push_back(&V,&tmp);
          cVar4 = '\0';
          bVar3 = false;
        }
      }
    }
    bVar15 = bVar3;
  }
  lVar5 = 0;
  part._M_elems[0] = 0;
  part._M_elems[1] = 1;
  do {
    paVar2 = V.
             super__Vector_base<std::array<signed_char,_4UL>,_std::allocator<std::array<signed_char,_4UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (lVar5 == 8) {
      printf("Day 19 Part 1: %u\nDay 19 Part 2: %u\n",(ulong)part._M_elems & 0xffffffff,
             (ulong)part._M_elems >> 0x20);
      std::
      _Vector_base<std::array<signed_char,_4UL>,_std::allocator<std::array<signed_char,_4UL>_>_>::
      ~_Vector_base(&V.
                     super__Vector_base<std::array<signed_char,_4UL>,_std::allocator<std::array<signed_char,_4UL>_>_>
                   );
      return;
    }
    uVar7 = *(uint32_t *)((long)part._M_elems + lVar5);
    R = (uint32_t  [8])ZEXT1632(CONCAT124(SUB1612(ZEXT816(0) << 0x40,4),uVar7));
    lVar12 = (long)V.
                   super__Vector_base<std::array<signed_char,_4UL>,_std::allocator<std::array<signed_char,_4UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)V.
                   super__Vector_base<std::array<signed_char,_4UL>,_std::allocator<std::array<signed_char,_4UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar8 = R[bVar6];
    while (uVar11 = (ulong)uVar8, uVar11 < (ulong)(lVar12 >> 2)) {
      uVar10 = (uint)paVar2[uVar11]._M_elems[2];
      cVar4 = paVar2[uVar11]._M_elems[0];
      uVar8 = R[(int)paVar2[uVar11]._M_elems[1] & 7];
      uVar1 = R[uVar10 & 7];
      if (cVar4 == '\x02') {
        uVar9 = uVar1 + uVar8;
      }
      else {
        uVar9 = (int)paVar2[uVar11]._M_elems[1];
        if ((cVar4 != 'M') && (uVar9 = uVar8, cVar4 != 'V')) {
          if (cVar4 == -0x33) {
            uVar9 = uVar8 * uVar10;
          }
          else if (cVar4 == -0x2a) {
            uVar9 = uVar1 * uVar8;
          }
          else {
            if (cVar4 != -7) {
              uVar7 = uVar1;
              if (cVar4 != 'B') goto LAB_0010e558;
              break;
            }
            uVar9 = uVar8 + uVar10;
          }
        }
      }
      R[(byte)paVar2[uVar11]._M_elems[3] & 7] = uVar9;
      uVar8 = R[bVar6] + 1;
      R[bVar6] = uVar8;
    }
    divisor_sum = 1;
    try_factor.n = &local_9c;
    local_4c[0] = 2;
    local_4c[1] = 3;
    try_factor.divisor_sum = &divisor_sum;
    local_4c[2] = 5;
    local_9c = uVar7;
    for (lVar12 = 0; lVar12 != 0xc; lVar12 = lVar12 + 4) {
      ::divisor_sum::anon_class_16_2_9b1e4325::operator()
                (&try_factor,*(uint32_t *)((long)local_4c + lVar12));
    }
    uVar7 = 7;
    uVar10 = 0x62642424;
    while (uVar7 * uVar7 <= local_9c) {
      ::divisor_sum::anon_class_16_2_9b1e4325::operator()(&try_factor,uVar7);
      uVar7 = uVar7 + (uVar10 & 0xf);
      uVar10 = uVar10 >> 4 | uVar10 << 0x1c;
    }
    iVar14 = local_9c + 1;
    if (local_9c < 2) {
      iVar14 = 1;
    }
    *(uint32_t *)((long)part._M_elems + lVar5) = iVar14 * divisor_sum;
    lVar5 = lVar5 + 4;
  } while( true );
}

Assistant:

void day19(input_t input) {
	int8_t ipreg = -1;

	while (input.len--) {
		uint8_t c = *input.s++ - '0';
		if (c < 6) {
			ipreg = c;
			break;
		}
	}
	if (ipreg == -1) {
		abort();
	}

	std::vector<Quad> V;
	Quad tmp;
	for (int have = 0, n = 0, i = 0; input.len--; input.s++) {
		uint8_t c = *input.s - '0';
		if (c < 100) {
			have = 1;
			n = 10 * n + c;
		} else if (have) {
			tmp[i] = n;
			n = have = 0;
			if (++i == 4) {
				i = 0;
				V.push_back(tmp);
			}
		}
	}

	std::array<uint32_t, 2> part = { 0, 1 };
	for (auto&& P : part) {
		uint32_t R[8] = { P };
		for (auto &ip = R[ipreg]; ip < V.size(); ip++) {
			auto &O = V[ip];
			auto Ia = O[1],    Ib = O[2],     Ic = O[3];
			auto Ra = R[Ia&7], Rb = R[Ib&7], &Rc = R[Ic&7];
			switch (O[0]) {
			    case  -7: Rc = Ra + Ib;    break;     // addi
			    case   2: Rc = Ra + Rb;    break;     // addr
			    case  66: P  = Rb;         goto done; // eqrr
			    case -51: Rc = Ra * Ib;    break;     // muli
			    case -42: Rc = Ra * Rb;    break;     // mulr
			    case  77: Rc = Ia;         break;     // seti
			    case  86: Rc = Ra;         break;     // setr
			    default: abort();
			}
		}
done:
		P = divisor_sum(P);
	}

	printf("Day 19 Part 1: %u\nDay 19 Part 2: %u\n", part[0], part[1]);
}